

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O3

vorbis_info_floor * floor0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  vorbis_info_floor0 *info;
  ulong uVar8;
  
  pvVar1 = vi->codec_setup;
  __ptr = (int *)malloc(0x68);
  lVar3 = oggpack_read(opb,8);
  *__ptr = (int)lVar3;
  lVar4 = oggpack_read(opb,0x10);
  *(long *)(__ptr + 2) = lVar4;
  lVar5 = oggpack_read(opb,0x10);
  *(long *)(__ptr + 4) = lVar5;
  lVar6 = oggpack_read(opb,6);
  __ptr[6] = (int)lVar6;
  lVar6 = oggpack_read(opb,8);
  __ptr[7] = (int)lVar6;
  lVar6 = oggpack_read(opb,4);
  uVar7 = (uint)lVar6 + 1;
  __ptr[8] = uVar7;
  if ((lVar4 < 1 || (int)lVar3 < 1) || (0x7ffffffe < (uint)lVar6 || lVar5 < 1)) {
LAB_001361c9:
    free(__ptr);
    __ptr = (int *)0x0;
  }
  else {
    uVar8 = 0;
    do {
      lVar3 = oggpack_read(opb,8);
      iVar2 = (int)lVar3;
      __ptr[uVar8 + 9] = iVar2;
      if ((iVar2 < 0) || (*(int *)((long)pvVar1 + 0x24) <= iVar2)) goto LAB_001361c9;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return __ptr;
}

Assistant:

static vorbis_info_floor *floor0_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j;

  vorbis_info_floor0 *info=(vorbis_info_floor0 *)_ogg_malloc(sizeof(*info));
  info->order=oggpack_read(opb,8);
  info->rate=oggpack_read(opb,16);
  info->barkmap=oggpack_read(opb,16);
  info->ampbits=oggpack_read(opb,6);
  info->ampdB=oggpack_read(opb,8);
  info->numbooks=oggpack_read(opb,4)+1;
  
  if(info->order<1)goto err_out;
  if(info->rate<1)goto err_out;
  if(info->barkmap<1)goto err_out;
  if(info->numbooks<1)goto err_out;
    
  for(j=0;j<info->numbooks;j++){
    info->books[j]=oggpack_read(opb,8);
    if(info->books[j]<0 || info->books[j]>=ci->books)goto err_out;
  }
  return(info);

 err_out:
  floor0_free_info(info);
  return(NULL);
}